

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O0

int Min_CoverSuppVarNum(Min_Man_t *p,Min_Cube_t *pCover)

{
  int iVar1;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Min_Cube_t *pCube;
  Min_Cube_t *pCover_local;
  Min_Man_t *p_local;
  
  if (pCover == (Min_Cube_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    for (local_2c = 0; _Counter = pCover,
        local_2c < (int)(*(uint *)&pCover->field_0x8 >> 10 & 0xfff); local_2c = local_2c + 1) {
      p->pTemp->uData[local_2c] = 0xffffffff;
    }
    for (; _Counter != (Min_Cube_t *)0x0; _Counter = _Counter->pNext) {
      for (local_2c = 0; local_2c < (int)(*(uint *)&pCover->field_0x8 >> 10 & 0xfff);
          local_2c = local_2c + 1) {
        p->pTemp->uData[local_2c] = _Counter->uData[local_2c] & p->pTemp->uData[local_2c];
      }
    }
    local_30 = 0;
    for (local_2c = 0; local_2c < (int)(*(uint *)&pCover->field_0x8 & 0x3ff);
        local_2c = local_2c + 1) {
      iVar1 = Min_CubeGetVar(p->pTemp,local_2c);
      local_30 = (uint)(iVar1 != 3) + local_30;
    }
    p_local._4_4_ = local_30;
  }
  return p_local._4_4_;
}

Assistant:

int Min_CoverSuppVarNum( Min_Man_t * p, Min_Cube_t * pCover )
{
    Min_Cube_t * pCube;
    int i, Counter;
    if ( pCover == NULL )
        return 0;
    // clean the cube
    for ( i = 0; i < (int)pCover->nWords; i++ )
        p->pTemp->uData[i]  = ~((unsigned)0);
    // add the bit data
    Min_CoverForEachCube( pCover, pCube )
        for ( i = 0; i < (int)pCover->nWords; i++ )
            p->pTemp->uData[i] &= pCube->uData[i];
    // count the vars
    Counter = 0;
    for ( i = 0; i < (int)pCover->nVars; i++ )
        Counter += ( Min_CubeGetVar(p->pTemp, i) != 3 );
    return Counter;
}